

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O0

string * duckdb_apache::thrift::to_string<duckdb_parquet::SchemaElement>
                   (vector<duckdb_parquet::SchemaElement,_true> *t)

{
  ostream *poVar1;
  string *in_RDI;
  ostringstream o;
  vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
  *in_stack_fffffffffffffe08;
  string local_1b8 [48];
  ostringstream local_188 [328];
  __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_duckdb_parquet::SchemaElement_*,_std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>_>
  *in_stack_ffffffffffffffc8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"[");
  std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::begin
            (in_stack_fffffffffffffe08);
  std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::end
            (in_stack_fffffffffffffe08);
  to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::SchemaElement_const*,std::vector<duckdb_parquet::SchemaElement,std::allocator<duckdb_parquet::SchemaElement>>>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  poVar1 = std::operator<<(poVar1,local_1b8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}